

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bssrdf.cpp
# Opt level: O2

void __thiscall
pbrt::BSSRDFTable::BSSRDFTable(BSSRDFTable *this,int nRhoSamples,int nRadiusSamples,Allocator alloc)

{
  polymorphic_allocator<float> local_40;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *local_38;
  
  local_40.memoryResource = alloc.memoryResource;
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector
            (&this->rhoSamples,(long)nRhoSamples,&local_40);
  local_38 = &this->radiusSamples;
  local_40.memoryResource = alloc.memoryResource;
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector
            (local_38,(long)nRadiusSamples,&local_40);
  local_40.memoryResource = alloc.memoryResource;
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector
            (&this->profile,(long)(nRadiusSamples * nRhoSamples),&local_40);
  local_40.memoryResource = alloc.memoryResource;
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector
            (&this->rhoEff,(long)nRhoSamples,&local_40);
  local_40.memoryResource = alloc.memoryResource;
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector
            (&this->profileCDF,(long)(nRadiusSamples * nRhoSamples),&local_40);
  return;
}

Assistant:

BSSRDFTable::BSSRDFTable(int nRhoSamples, int nRadiusSamples, Allocator alloc)
    : rhoSamples(nRhoSamples, alloc),
      radiusSamples(nRadiusSamples, alloc),
      profile(nRadiusSamples * nRhoSamples, alloc),
      rhoEff(nRhoSamples, alloc),
      profileCDF(nRadiusSamples * nRhoSamples, alloc) {}